

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileFStream::Open
          (FileFStream *this,string *name,Mode openMode,bool async,bool directio)

{
  int iVar1;
  _Ios_Openmode __a;
  _Ios_Openmode _Var2;
  byte in_CL;
  undefined4 in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  byte in_R8B;
  type lf_AsyncOpenWrite;
  string *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  Transport *in_stack_fffffffffffffdd0;
  Transport *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  allocator *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  type *in_stack_fffffffffffffe30;
  allocator *paVar3;
  undefined8 in_stack_fffffffffffffe38;
  launch __policy;
  string local_1b0 [8];
  string *in_stack_fffffffffffffe58;
  FileFStream *in_stack_fffffffffffffe60;
  string local_190 [32];
  string local_170 [32];
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [58];
  byte local_16;
  byte local_15;
  undefined4 local_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  __policy = (launch)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_15 = in_CL & 1;
  local_16 = in_R8B & 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 9),(string *)in_RSI);
  (**(code **)(*in_RDI + 0x98))();
  *(undefined4 *)(in_RDI + 0xd) = local_14;
  iVar1 = (int)in_RDI[0xd];
  if (iVar1 == 1) {
    if ((local_15 & 1) == 0) {
      paVar3 = &local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"open",paVar3);
      Transport::ProfilerStart(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      _Var2 = (_Ios_Openmode)local_10;
      __a = std::operator|(_S_out,_S_bin);
      std::operator|(__a,_S_trunc);
      std::fstream::open((string *)(in_RDI + 0x1e),_Var2);
      paVar3 = &local_89;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"open",paVar3);
      Transport::ProfilerStop(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
    else {
      *(undefined1 *)(in_RDI + 0x60) = 1;
      std::
      async<adios2::transport::FileFStream::Open(std::__cxx11::string_const&,adios2::Mode,bool,bool)::__0&,std::__cxx11::string_const&>
                (__policy,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      std::future<void>::operator=
                ((future<void> *)in_stack_fffffffffffffdd0,(future<void> *)in_stack_fffffffffffffdc8
                );
      std::future<void>::~future((future<void> *)0xd59f5f);
    }
  }
  else if (iVar1 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"open",&local_101);
    in_stack_fffffffffffffdc8 = &local_100;
    Transport::ProfilerStart(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffdc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    this_00 = (Transport *)(in_RDI + 0x1e);
    std::operator|(_S_in,_S_bin);
    std::fstream::open((string *)this_00,(_Ios_Openmode)local_10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"open",&local_129);
    Transport::ProfilerStop(this_00,in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  else if (iVar1 == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"open",&local_b1);
    Transport::ProfilerStart(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    _Var2 = std::operator|(_S_in,_S_out);
    std::operator|(_Var2,_S_bin);
    std::fstream::open((string *)(in_RDI + 0x1e),(_Ios_Openmode)local_10);
    std::ostream::seekp((long)(in_RDI + 0x20),_S_beg);
    in_stack_fffffffffffffe08 = &local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"open",in_stack_fffffffffffffe08);
    Transport::ProfilerStop(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    in_stack_fffffffffffffe00 = local_10;
  }
  else {
    in_stack_fffffffffffffdc0 = local_170;
    std::operator+((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    CheckFile(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_170);
  }
  if ((*(byte *)(in_RDI + 0x60) & 1) == 0) {
    std::operator+((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    CheckFile(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_1b0);
    *(undefined1 *)((long)in_RDI + 0x6c) = 1;
  }
  return;
}

Assistant:

void FileFStream::Open(const std::string &name, const Mode openMode, const bool async,
                       const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> void {
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
        ProfilerStop("open");
    };
    m_Name = name;
    CheckName();
    m_OpenMode = openMode;

    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            ProfilerStart("open");
            m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::out | std::fstream::binary);
        m_FileStream.seekp(0, std::ios_base::end);
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::binary);
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to stream open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to fstream open");
        m_IsOpen = true;
    }
}